

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

void beta_values(int *n_data,double *x,double *y,double *fxy)

{
  uint uVar1;
  double dVar2;
  
  uVar1 = *n_data;
  if ((int)uVar1 < 0) {
    *n_data = 1;
    uVar1 = 0;
  }
  else {
    *n_data = uVar1 + 1;
    if (0x10 < uVar1) {
      *n_data = 0;
      *x = 0.0;
      *y = 0.0;
      dVar2 = 0.0;
      goto LAB_00193ff8;
    }
  }
  *x = beta_values::x_vec[uVar1];
  *y = beta_values::y_vec[uVar1];
  dVar2 = beta_values::b_vec[uVar1];
LAB_00193ff8:
  *fxy = dVar2;
  return;
}

Assistant:

void beta_values ( int &n_data, double &x, double &y, double &fxy )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_VALUES returns some values of the Beta function.
//
//  Discussion:
//
//    Beta(X,Y) = ( Gamma(X) * Gamma(Y) ) / Gamma(X+Y)
//
//    Both X and Y must be greater than 0.
//
//    In Mathematica, the function can be evaluated by:
//
//      Beta[X,Y]
//
//  Properties:
//
//    Beta(X,Y) = Beta(Y,X).
//    Beta(X,Y) = Integral ( 0 <= T <= 1 ) T^(X-1) (1-T)^(Y-1) dT.
//    Beta(X,Y) = Gamma(X) * Gamma(Y) / Gamma(X+Y)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//  Parameters:
//
//    Input/output, int &N_DATA.  The user sets N_DATA to 0 before the
//    first call.  On each call, the routine increments N_DATA by 1, and
//    returns the corresponding data; when there is no more data, the
//    output value of N_DATA will be 0 again.
//
//    Output, double &X, &Y, the arguments of the function.
//
//    Output, double &FXY, the value of the function.
//
{
# define N_MAX 17

  static double b_vec[N_MAX] = {
     0.5000000000000000E+01,
     0.2500000000000000E+01,
     0.1666666666666667E+01,
     0.1250000000000000E+01,
     0.5000000000000000E+01,
     0.2500000000000000E+01,
     0.1000000000000000E+01,
     0.1666666666666667E+00,
     0.3333333333333333E-01,
     0.7142857142857143E-02,
     0.1587301587301587E-02,
     0.2380952380952381E-01,
     0.5952380952380952E-02,
     0.1984126984126984E-02,
     0.7936507936507937E-03,
     0.3607503607503608E-03,
     0.8325008325008325E-04 };

  static double x_vec[N_MAX] = {
     0.2E+00,
     0.4E+00,
     0.6E+00,
     0.8E+00,
     1.0E+00,
     1.0E+00,
     1.0E+00,
     2.0E+00,
     3.0E+00,
     4.0E+00,
     5.0E+00,
     6.0E+00,
     6.0E+00,
     6.0E+00,
     6.0E+00,
     6.0E+00,
     7.0E+00 };

  static double y_vec[N_MAX] = {
     1.0E+00,
     1.0E+00,
     1.0E+00,
     1.0E+00,
     0.2E+00,
     0.4E+00,
     1.0E+00,
     2.0E+00,
     3.0E+00,
     4.0E+00,
     5.0E+00,
     2.0E+00,
     3.0E+00,
     4.0E+00,
     5.0E+00,
     6.0E+00,
     7.0E+00 };

  if ( n_data < 0 )
  {
    n_data = 0;
  }

  n_data = n_data + 1;

  if ( N_MAX < n_data )
  {
    n_data = 0;
    x = 0.0;
    y = 0.0;
    fxy = 0.0;
  }
  else
  {
    x = x_vec[n_data-1];
    y = y_vec[n_data-1];
    fxy = b_vec[n_data-1];
  }

  return;
# undef N_MAX
}